

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_parse(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  bool bVar1;
  char *pcVar2;
  size_t local_60;
  size_t use_len;
  mbedtls_pem_context pem;
  int local_38;
  int ret;
  int buf_format;
  int total_failed;
  int first_error;
  int success;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_x509_crt *chain_local;
  
  bVar1 = false;
  buf_format = 0;
  ret = 0;
  local_38 = 1;
  if ((chain == (mbedtls_x509_crt *)0x0) || (buf == (uchar *)0x0)) {
    chain_local._4_4_ = -0x2800;
  }
  else {
    if (((buflen != 0) && (buf[buflen - 1] == '\0')) &&
       (pcVar2 = strstr((char *)buf,"-----BEGIN CERTIFICATE-----"), pcVar2 != (char *)0x0)) {
      local_38 = 2;
    }
    if (local_38 == 1) {
      chain_local._4_4_ = mbedtls_x509_crt_parse_der(chain,buf,buflen);
    }
    else {
      if (local_38 == 2) {
        pem.info._4_4_ = -0x6e;
        _first_error = buflen;
        buflen_local = (size_t)buf;
        while (1 < _first_error) {
          mbedtls_pem_init((mbedtls_pem_context *)&use_len);
          pem.info._4_4_ =
               mbedtls_pem_read_buffer
                         ((mbedtls_pem_context *)&use_len,"-----BEGIN CERTIFICATE-----",
                          "-----END CERTIFICATE-----",(uchar *)buflen_local,(uchar *)0x0,0,&local_60
                         );
          if (pem.info._4_4_ == 0) {
            _first_error = _first_error - local_60;
            buflen_local = local_60 + buflen_local;
            pem.info._4_4_ = mbedtls_x509_crt_parse_der(chain,(uchar *)use_len,(size_t)pem.buf);
            mbedtls_pem_free((mbedtls_pem_context *)&use_len);
            if (pem.info._4_4_ == 0) {
              bVar1 = true;
            }
            else {
              if (pem.info._4_4_ == -0x2880) {
                return -0x2880;
              }
              if (buf_format == 0) {
                buf_format = pem.info._4_4_;
              }
              ret = ret + 1;
            }
          }
          else {
            if (pem.info._4_4_ == -0x1480) {
              return -0x1480;
            }
            if (pem.info._4_4_ == -0x1080) break;
            mbedtls_pem_free((mbedtls_pem_context *)&use_len);
            _first_error = _first_error - local_60;
            buflen_local = local_60 + buflen_local;
            if (buf_format == 0) {
              buf_format = pem.info._4_4_;
            }
            ret = ret + 1;
          }
        }
      }
      if (bVar1) {
        chain_local._4_4_ = ret;
      }
      else if (buf_format == 0) {
        chain_local._4_4_ = -0x2780;
      }
      else {
        chain_local._4_4_ = buf_format;
      }
    }
  }
  return chain_local._4_4_;
}

Assistant:

int mbedtls_x509_crt_parse(mbedtls_x509_crt *chain,
                           const unsigned char *buf,
                           size_t buflen)
{
#if defined(MBEDTLS_PEM_PARSE_C)
    int success = 0, first_error = 0, total_failed = 0;
    int buf_format = MBEDTLS_X509_FORMAT_DER;
#endif

    /*
     * Check for valid input
     */
    if (chain == NULL || buf == NULL) {
        return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
    }

    /*
     * Determine buffer content. Buffer contains either one DER certificate or
     * one or more PEM certificates.
     */
#if defined(MBEDTLS_PEM_PARSE_C)
    if (buflen != 0 && buf[buflen - 1] == '\0' &&
        strstr((const char *) buf, "-----BEGIN CERTIFICATE-----") != NULL) {
        buf_format = MBEDTLS_X509_FORMAT_PEM;
    }

    if (buf_format == MBEDTLS_X509_FORMAT_DER) {
        return mbedtls_x509_crt_parse_der(chain, buf, buflen);
    }
#else
    return mbedtls_x509_crt_parse_der(chain, buf, buflen);
#endif

#if defined(MBEDTLS_PEM_PARSE_C)
    if (buf_format == MBEDTLS_X509_FORMAT_PEM) {
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        mbedtls_pem_context pem;

        /* 1 rather than 0 since the terminating NULL byte is counted in */
        while (buflen > 1) {
            size_t use_len;
            mbedtls_pem_init(&pem);

            /* If we get there, we know the string is null-terminated */
            ret = mbedtls_pem_read_buffer(&pem,
                                          "-----BEGIN CERTIFICATE-----",
                                          "-----END CERTIFICATE-----",
                                          buf, NULL, 0, &use_len);

            if (ret == 0) {
                /*
                 * Was PEM encoded
                 */
                buflen -= use_len;
                buf += use_len;
            } else if (ret == MBEDTLS_ERR_PEM_BAD_INPUT_DATA) {
                return ret;
            } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
                mbedtls_pem_free(&pem);

                /*
                 * PEM header and footer were found
                 */
                buflen -= use_len;
                buf += use_len;

                if (first_error == 0) {
                    first_error = ret;
                }

                total_failed++;
                continue;
            } else {
                break;
            }

            ret = mbedtls_x509_crt_parse_der(chain, pem.buf, pem.buflen);

            mbedtls_pem_free(&pem);

            if (ret != 0) {
                /*
                 * Quit parsing on a memory error
                 */
                if (ret == MBEDTLS_ERR_X509_ALLOC_FAILED) {
                    return ret;
                }

                if (first_error == 0) {
                    first_error = ret;
                }

                total_failed++;
                continue;
            }

            success = 1;
        }
    }

    if (success) {
        return total_failed;
    } else if (first_error) {
        return first_error;
    } else {
        return MBEDTLS_ERR_X509_CERT_UNKNOWN_FORMAT;
    }
#endif /* MBEDTLS_PEM_PARSE_C */
}